

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

void __thiscall Kumu::MemIOWriter::MemIOWriter(MemIOWriter *this,ByteString *Buf)

{
  ui32_t uVar1;
  byte_t *pbVar2;
  ByteString *Buf_local;
  MemIOWriter *this_local;
  
  this->m_p = (byte_t *)0x0;
  this->m_capacity = 0;
  this->m_size = 0;
  pbVar2 = ByteString::Data(Buf);
  this->m_p = pbVar2;
  uVar1 = ByteString::Capacity(Buf);
  this->m_capacity = uVar1;
  if (this->m_p == (byte_t *)0x0) {
    __assert_fail("m_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,0x415,"Kumu::MemIOWriter::MemIOWriter(ByteString *)");
  }
  if (this->m_capacity != 0) {
    return;
  }
  __assert_fail("m_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x415,"Kumu::MemIOWriter::MemIOWriter(ByteString *)");
}

Assistant:

Kumu::MemIOWriter::MemIOWriter(ByteString* Buf)
  : m_p(0), m_capacity(0), m_size(0)
{
  m_p = Buf->Data();
  m_capacity = Buf->Capacity();
  assert(m_p); assert(m_capacity);
}